

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<bsim::quad_value_bit_vector_const&>::
captureExpression<(Catch::Internal::Operator)1,bsim::quad_value_bit_vector>
          (ExpressionLhs<bsim::quad_value_bit_vector_const&> *this,quad_value_bit_vector *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = *(ResultBuilder **)this;
  result = Internal::
           Evaluator<bsim::quad_value_bit_vector,_bsim::quad_value_bit_vector,_(Catch::Internal::Operator)1>
           ::evaluate(*(quad_value_bit_vector **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Detail::StringMakerBase<true>::convert<bsim::quad_value_bit_vector>
            (&local_38,*(quad_value_bit_vector **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::StringMakerBase<true>::convert<bsim::quad_value_bit_vector>(&local_58,rhs);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string((string *)&local_78,"!=",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }